

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O3

void nsvg__parseGradientStop(NSVGparser *p,char **attr)

{
  int iVar1;
  int iVar2;
  NSVGgradientData *pNVar3;
  bool bVar4;
  NSVGgradientStop *pNVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  char *name;
  ulong uVar9;
  char **ppcVar10;
  float fVar11;
  
  iVar1 = p->attrHead;
  p->attr[iVar1].stopColor = 0;
  p->attr[iVar1].stopOpacity = 1.0;
  p->attr[iVar1].stopOffset = 0.0;
  name = *attr;
  if (name != (char *)0x0) {
    ppcVar10 = attr + 2;
    do {
      nsvg__parseAttr(p,name,ppcVar10[-1]);
      name = *ppcVar10;
      ppcVar10 = ppcVar10 + 2;
    } while (name != (char *)0x0);
  }
  pNVar3 = p->gradients;
  if (pNVar3 != (NSVGgradientData *)0x0) {
    iVar2 = pNVar3->nstops;
    pNVar3->nstops = iVar2 + 1;
    pNVar5 = (NSVGgradientStop *)realloc(pNVar3->stops,(long)iVar2 * 8 + 8);
    pNVar3->stops = pNVar5;
    if (pNVar5 != (NSVGgradientStop *)0x0) {
      iVar2 = pNVar3->nstops;
      uVar6 = iVar2 - 1;
      fVar11 = p->attr[iVar1].stopOffset;
      if (1 < (long)iVar2) {
        uVar9 = 0;
        do {
          if (fVar11 < pNVar5[uVar9].offset) {
            uVar8 = (uint)uVar9;
            bVar4 = (int)uVar8 < (int)uVar6;
            uVar6 = uVar8;
            if (bVar4) {
              lVar7 = (long)iVar2 + -1;
              do {
                pNVar3->stops[lVar7] = pNVar3->stops[lVar7 + -1];
                lVar7 = lVar7 + -1;
              } while ((long)uVar9 < lVar7);
              pNVar5 = pNVar3->stops;
              fVar11 = p->attr[iVar1].stopOffset;
            }
            break;
          }
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      pNVar5[(int)uVar6].color =
           (int)(long)(p->attr[iVar1].stopOpacity * 255.0) << 0x18 | p->attr[iVar1].stopColor;
      pNVar5[(int)uVar6].offset = fVar11;
    }
  }
  return;
}

Assistant:

static void nsvg__parseGradientStop(NSVGparser* p, const char** attr)
{
	NSVGattrib* curAttr = nsvg__getAttr(p);
	NSVGgradientData* grad;
	NSVGgradientStop* stop;
	int i, idx;

	curAttr->stopOffset = 0;
	curAttr->stopColor = 0;
	curAttr->stopOpacity = 1.0f;

	for (i = 0; attr[i]; i += 2) {
		nsvg__parseAttr(p, attr[i], attr[i + 1]);
	}

	// Add stop to the last gradient.
	grad = p->gradients;
	if (grad == NULL) return;

	grad->nstops++;
	grad->stops = (NSVGgradientStop*)realloc(grad->stops, sizeof(NSVGgradientStop)*grad->nstops);
	if (grad->stops == NULL) return;

	// Insert
	idx = grad->nstops-1;
	for (i = 0; i < grad->nstops-1; i++) {
		if (curAttr->stopOffset < grad->stops[i].offset) {
			idx = i;
			break;
		}
	}
	if (idx != grad->nstops-1) {
		for (i = grad->nstops-1; i > idx; i--)
			grad->stops[i] = grad->stops[i-1];
	}

	stop = &grad->stops[idx];
	stop->color = curAttr->stopColor;
	stop->color |= (unsigned int)(curAttr->stopOpacity*255) << 24;
	stop->offset = curAttr->stopOffset;
}